

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xMapping.c
# Opt level: O1

char * TMS320C64x_reg_name(csh handle,uint reg)

{
  if (0x59 < reg) {
    return (char *)0x0;
  }
  return reg_name_maps[reg].name;
}

Assistant:

const char *TMS320C64x_reg_name(csh handle, unsigned int reg)
{
#ifndef CAPSTONE_DIET
	if (reg >= ARR_SIZE(reg_name_maps))
		return NULL;

	return reg_name_maps[reg].name;
#else
	return NULL;
#endif
}